

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j1939acd.c
# Opt level: O0

int open_socket(char *device,uint64_t name)

{
  FILE *__stream;
  char *pcVar1;
  undefined8 in_RSI;
  char *in_RDI;
  sockaddr_can saddr;
  int value;
  int sock;
  int ret;
  sockaddr_can *in_stack_ffffffffffffffc0;
  sockaddr local_38;
  undefined4 local_28;
  undefined1 local_24;
  undefined4 local_1c;
  int local_18;
  int local_14;
  char local_10 [16];
  
  local_38.sa_family = 0x1d;
  local_10._0_8_ = in_RSI;
  local_38.sa_data._2_4_ = if_nametoindex(in_RDI);
  local_38.sa_data[6] = local_10[0];
  local_38.sa_data[7] = local_10[1];
  local_38.sa_data[8] = local_10[2];
  local_38.sa_data[9] = local_10[3];
  local_38.sa_data[10] = local_10[4];
  local_38.sa_data[0xb] = local_10[5];
  local_38.sa_data[0xc] = local_10[6];
  local_38.sa_data[0xd] = local_10[7];
  local_28 = 0x40000;
  local_24 = 0xfe;
  if (s.verbose != 0) {
    fprintf(_stderr,"- socket(PF_CAN, SOCK_DGRAM, CAN_J1939);\n");
  }
  local_18 = socket(0x1d,2,7);
  local_14 = local_18;
  if (local_18 < 0) {
    err(1,"socket(j1939)");
  }
  if (s.verbose != 0) {
    fprintf(_stderr,"- setsockopt(, SOL_CAN_J1939, SO_J1939_FILTER, <filter>, %zd);\n",0x60);
  }
  local_14 = setsockopt(local_18,0x6b,1,filt,0x60);
  if (local_14 < 0) {
    err(1,"setsockopt filter");
  }
  local_1c = 1;
  if (s.verbose != 0) {
    fprintf(_stderr,"- setsockopt(, SOL_SOCKET, SO_BROADCAST, %d, %zd);\n",1,4);
  }
  local_14 = setsockopt(local_18,1,6,&local_1c,4);
  if (local_14 < 0) {
    err(1,"setsockopt set broadcast");
  }
  __stream = _stderr;
  if (s.verbose != 0) {
    pcVar1 = libj1939_addr2str(in_stack_ffffffffffffffc0);
    fprintf(__stream,"- bind(, %s, %zi);\n",pcVar1,0x18);
  }
  local_14 = bind(local_18,&local_38,0x18);
  if (local_14 < 0) {
    err(1,"bind()");
  }
  return local_18;
}

Assistant:

static int open_socket(const char *device, uint64_t name)
{
	int ret, sock;
	int value;
	struct sockaddr_can saddr = {
		.can_family = AF_CAN,
		.can_addr.j1939 = {
			.name = name,
			.addr = J1939_IDLE_ADDR,
			.pgn = J1939_NO_PGN,
		},
		.can_ifindex = if_nametoindex(device),
	};

	if (s.verbose)
		fprintf(stderr, "- socket(PF_CAN, SOCK_DGRAM, CAN_J1939);\n");
	sock = ret = socket(PF_CAN, SOCK_DGRAM, CAN_J1939);
	if (ret < 0)
		err(1, "socket(j1939)");

	if (s.verbose)
		fprintf(stderr, "- setsockopt(, SOL_CAN_J1939, SO_J1939_FILTER, <filter>, %zd);\n", sizeof(filt));
	ret = setsockopt(sock, SOL_CAN_J1939, SO_J1939_FILTER,
			&filt, sizeof(filt));
	if (ret < 0)
		err(1, "setsockopt filter");

	value = 1;
	if (s.verbose)
		fprintf(stderr, "- setsockopt(, SOL_SOCKET, SO_BROADCAST, %d, %zd);\n", value, sizeof(value));
	ret = setsockopt(sock, SOL_SOCKET, SO_BROADCAST,
			&value, sizeof(value));
	if (ret < 0)
		err(1, "setsockopt set broadcast");

	if (s.verbose)
		fprintf(stderr, "- bind(, %s, %zi);\n", libj1939_addr2str(&saddr), sizeof(saddr));
	ret = bind(sock, (void *)&saddr, sizeof(saddr));
	if (ret < 0)
		err(1, "bind()");
	return sock;
}